

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttcpal.c
# Opt level: O3

FT_Error tt_face_load_cpal(TT_Face face,FT_Stream stream)

{
  uint uVar1;
  FT_Memory memory;
  ushort uVar2;
  FT_Error FVar3;
  ushort *P;
  ushort *puVar4;
  FT_Color *pFVar5;
  ushort uVar6;
  ulong uVar7;
  ushort uVar8;
  ushort *puVar9;
  ushort uVar10;
  uint uVar11;
  uint uVar12;
  ushort *puVar14;
  FT_Error error;
  FT_Byte *table;
  FT_ULong table_size;
  FT_Error local_4c;
  ushort *local_48;
  ulong local_40;
  ulong local_38;
  ulong uVar13;
  
  memory = (face->root).memory;
  local_48 = (ushort *)0x0;
  local_4c = (*face->goto_table)(face,0x4350414c,stream,&local_40);
  if (local_4c == 0) {
    if (local_40 < 0xc) {
      P = (ushort *)0x0;
      goto LAB_00245354;
    }
    local_4c = FT_Stream_ExtractFrame(stream,local_40,(FT_Byte **)&local_48);
    puVar4 = local_48;
    if (local_4c == 0) {
      P = (ushort *)ft_mem_alloc(memory,0x28,&local_4c);
      if (local_4c != 0) goto LAB_0024535c;
      uVar8 = *puVar4 << 8 | *puVar4 >> 8;
      *P = uVar8;
      if (uVar8 < 2) {
        uVar6 = puVar4[1] << 8 | puVar4[1] >> 8;
        (face->palette_data).num_palette_entries = uVar6;
        uVar2 = puVar4[2] << 8 | puVar4[2] >> 8;
        (face->palette_data).num_palettes = uVar2;
        uVar10 = puVar4[3] << 8 | puVar4[3] >> 8;
        P[1] = uVar10;
        if ((ulong)uVar2 * 2 + 0xc <= local_40) {
          uVar1 = *(uint *)(puVar4 + 4);
          uVar7 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                         uVar1 << 0x18);
          if (((uVar7 < local_40) && ((ulong)uVar10 << 2 <= local_40 - uVar7)) && (uVar6 <= uVar10))
          {
            *(ushort **)(P + 8) = puVar4 + 6;
            *(ulong *)(P + 4) = uVar7 + (long)local_48;
            if (uVar8 != 1) goto LAB_00245639;
            if ((uint)uVar2 * 2 + 0x18 <= local_40) {
              uVar7 = (ulong)((uint)uVar2 * 2);
              uVar1 = *(uint *)((long)(puVar4 + 6) + uVar7);
              uVar11 = *(uint *)((long)puVar4 + uVar7 + 0x10);
              uVar12 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                       uVar1 << 0x18;
              uVar13 = (ulong)uVar12;
              uVar1 = *(uint *)((long)puVar4 + uVar7 + 0x14);
              if (uVar12 != 0) {
                if ((local_40 <= uVar13) || (local_40 - uVar13 < uVar7)) goto LAB_00245354;
                local_38 = (ulong)uVar11;
                puVar4 = (ushort *)ft_mem_qrealloc(memory,2,0,(ulong)uVar2,(void *)0x0,&local_4c);
                if (local_4c != 0) goto LAB_0024535c;
                uVar8 = (face->palette_data).num_palettes;
                if (uVar8 != 0) {
                  puVar14 = (ushort *)(uVar13 + (long)local_48);
                  puVar9 = puVar4;
                  do {
                    *puVar9 = *puVar14 << 8 | *puVar14 >> 8;
                    puVar9 = puVar9 + 1;
                    puVar14 = puVar14 + 1;
                  } while (puVar9 < puVar4 + uVar8);
                }
                (face->palette_data).palette_flags = puVar4;
                uVar11 = (uint)local_38;
              }
              uVar7 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                             uVar11 << 0x18);
              if (uVar7 == 0) {
LAB_002455b3:
                uVar7 = (ulong)(uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 |
                               uVar1 << 0x18);
                if (uVar7 == 0) {
LAB_00245639:
                  *(ushort **)(P + 0xc) = local_48;
                  *(ulong *)(P + 0x10) = local_40;
                  face->cpal = P;
                  pFVar5 = (FT_Color *)
                           ft_mem_realloc(memory,4,0,(ulong)(face->palette_data).num_palette_entries
                                          ,(void *)0x0,&local_4c);
                  face->palette = pFVar5;
                  if (local_4c != 0) goto LAB_0024535c;
                  FVar3 = tt_face_palette_set(face,0);
                  if (FVar3 == 0) {
                    return 0;
                  }
                }
                else if (uVar7 < local_40) {
                  uVar8 = (face->palette_data).num_palette_entries;
                  if ((ulong)((uint)uVar8 + (uint)uVar8) <= local_40 - uVar7) {
                    puVar4 = (ushort *)
                             ft_mem_qrealloc(memory,2,0,(ulong)uVar8,(void *)0x0,&local_4c);
                    if (local_4c != 0) goto LAB_0024535c;
                    uVar8 = (face->palette_data).num_palette_entries;
                    if (uVar8 != 0) {
                      puVar14 = (ushort *)(uVar7 + (long)local_48);
                      puVar9 = puVar4;
                      do {
                        *puVar9 = *puVar14 << 8 | *puVar14 >> 8;
                        puVar9 = puVar9 + 1;
                        puVar14 = puVar14 + 1;
                      } while (puVar9 < puVar4 + uVar8);
                    }
                    (face->palette_data).palette_entry_name_ids = puVar4;
                    goto LAB_00245639;
                  }
                }
              }
              else if (uVar7 < local_40) {
                uVar8 = (face->palette_data).num_palettes;
                if ((ulong)((uint)uVar8 + (uint)uVar8) <= local_40 - uVar7) {
                  puVar4 = (ushort *)ft_mem_qrealloc(memory,2,0,(ulong)uVar8,(void *)0x0,&local_4c);
                  if (local_4c != 0) goto LAB_0024535c;
                  uVar8 = (face->palette_data).num_palettes;
                  if (uVar8 != 0) {
                    puVar14 = (ushort *)(uVar7 + (long)local_48);
                    puVar9 = puVar4;
                    do {
                      *puVar9 = *puVar14 << 8 | *puVar14 >> 8;
                      puVar9 = puVar9 + 1;
                      puVar14 = puVar14 + 1;
                    } while (puVar9 < puVar4 + uVar8);
                  }
                  (face->palette_data).palette_name_ids = puVar4;
                  goto LAB_002455b3;
                }
              }
            }
          }
        }
      }
LAB_00245354:
      local_4c = 8;
      goto LAB_0024535c;
    }
  }
  P = (ushort *)0x0;
LAB_0024535c:
  FT_Stream_ReleaseFrame(stream,(FT_Byte **)&local_48);
  ft_mem_free(memory,P);
  face->cpal = (void *)0x0;
  return local_4c;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_cpal( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error   error;
    FT_Memory  memory = face->root.memory;

    FT_Byte*  table = NULL;
    FT_Byte*  p     = NULL;

    Cpal*  cpal = NULL;

    FT_ULong  colors_offset;
    FT_ULong  table_size;


    error = face->goto_table( face, TTAG_CPAL, stream, &table_size );
    if ( error )
      goto NoCpal;

    if ( table_size < CPAL_V0_HEADER_BASE_SIZE )
      goto InvalidTable;

    if ( FT_FRAME_EXTRACT( table_size, table ) )
      goto NoCpal;

    p = table;

    if ( FT_NEW( cpal ) )
      goto NoCpal;

    cpal->version = FT_NEXT_USHORT( p );
    if ( cpal->version > 1 )
      goto InvalidTable;

    face->palette_data.num_palette_entries = FT_NEXT_USHORT( p );
    face->palette_data.num_palettes        = FT_NEXT_USHORT( p );

    cpal->num_colors = FT_NEXT_USHORT( p );
    colors_offset    = FT_NEXT_ULONG( p );

    if ( CPAL_V0_HEADER_BASE_SIZE             +
         face->palette_data.num_palettes * 2U > table_size )
      goto InvalidTable;

    if ( colors_offset >= table_size )
      goto InvalidTable;
    if ( cpal->num_colors * COLOR_SIZE > table_size - colors_offset )
      goto InvalidTable;

    if ( face->palette_data.num_palette_entries > cpal->num_colors )
      goto InvalidTable;

    cpal->color_indices = p;
    cpal->colors        = (FT_Byte*)( table + colors_offset );

    if ( cpal->version == 1 )
    {
      FT_ULong    type_offset, label_offset, entry_label_offset;
      FT_UShort*  array = NULL;
      FT_UShort*  limit;
      FT_UShort*  q;


      if ( CPAL_V0_HEADER_BASE_SIZE             +
           face->palette_data.num_palettes * 2U +
           3U * 4                               > table_size )
        goto InvalidTable;

      p += face->palette_data.num_palettes * 2U;

      type_offset        = FT_NEXT_ULONG( p );
      label_offset       = FT_NEXT_ULONG( p );
      entry_label_offset = FT_NEXT_ULONG( p );

      if ( type_offset )
      {
        if ( type_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - type_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + type_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_flags = array;
      }

      if ( label_offset )
      {
        if ( label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palettes * 2U >
               table_size - label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palettes ) )
          goto NoCpal;

        p     = table + label_offset;
        q     = array;
        limit = q + face->palette_data.num_palettes;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_name_ids = array;
      }

      if ( entry_label_offset )
      {
        if ( entry_label_offset >= table_size )
          goto InvalidTable;
        if ( face->palette_data.num_palette_entries * 2U >
               table_size - entry_label_offset )
          goto InvalidTable;

        if ( FT_QNEW_ARRAY( array, face->palette_data.num_palette_entries ) )
          goto NoCpal;

        p     = table + entry_label_offset;
        q     = array;
        limit = q + face->palette_data.num_palette_entries;

        while ( q < limit )
          *q++ = FT_NEXT_USHORT( p );

        face->palette_data.palette_entry_name_ids = array;
      }
    }

    cpal->table      = table;
    cpal->table_size = table_size;

    face->cpal = cpal;

    /* set up default palette */
    if ( FT_NEW_ARRAY( face->palette,
                       face->palette_data.num_palette_entries ) )
      goto NoCpal;

    if ( tt_face_palette_set( face, 0 ) )
      goto InvalidTable;

    return FT_Err_Ok;

  InvalidTable:
    error = FT_THROW( Invalid_Table );

  NoCpal:
    FT_FRAME_RELEASE( table );
    FT_FREE( cpal );

    face->cpal = NULL;

    /* arrays in `face->palette_data' and `face->palette' */
    /* are freed in `sfnt_done_face'                      */

    return error;
  }